

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_NoiseAlert(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  undefined1 local_58 [8];
  FActorIterator iter_1;
  FActorIterator iter;
  AActor *emitter;
  AActor *target;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  emitter = it;
  if (arg0 != 0) {
    FActorIterator::FActorIterator((FActorIterator *)&iter_1.id,arg0);
    emitter = FActorIterator::Next((FActorIterator *)&iter_1.id);
  }
  iter._8_8_ = it;
  if (arg1 != 0) {
    if (arg1 == arg0) {
      iter._8_8_ = emitter;
    }
    else {
      FActorIterator::FActorIterator((FActorIterator *)local_58,arg1);
      iter._8_8_ = FActorIterator::Next((FActorIterator *)local_58);
    }
  }
  P_NoiseAlert(emitter,(AActor *)iter._8_8_,false,0.0);
  return 1;
}

Assistant:

FUNC(LS_NoiseAlert)
// NoiseAlert (TID of target, TID of emitter)
{
	AActor *target, *emitter;

	if (arg0 == 0)
	{
		target = it;
	}
	else
	{
		FActorIterator iter (arg0);
		target = iter.Next();
	}

	if (arg1 == 0)
	{
		emitter = it;
	}
	else if (arg1 == arg0)
	{
		emitter = target;
	}
	else
	{
		FActorIterator iter (arg1);
		emitter = iter.Next();
	}

	P_NoiseAlert (target, emitter);
	return true;
}